

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O3

void __thiscall
gl4cts::KHRDebug::ReceiveingMessagesTest::inspectDebugState
          (ReceiveingMessagesTest *this,GLboolean expected_state,GLDEBUGPROC expected_callback,
          GLvoid *expected_user_info)

{
  ostringstream *this_00;
  GLenum GVar1;
  TestError *this_01;
  GLboolean debug_state;
  GLvoid *callback_user_info;
  GLvoid *callback_procedure;
  GLboolean local_1b1;
  void *local_1b0;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  local_1b1 = 0xff;
  (*((this->super_TestBase).m_gl)->getBooleanv)(0x92e0,&local_1b1);
  GVar1 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar1,"GetBooleanv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x710);
  if (local_1b1 == expected_state) {
    local_1a8._0_8_ = (TestLog *)0x0;
    (*((this->super_TestBase).m_gl)->getPointerv)(0x8244,(void **)local_1a8);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetPointerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x71c);
    if ((GLDEBUGPROC)local_1a8._0_8_ == expected_callback) {
      local_1b0 = (GLvoid *)0x0;
      (*((this->super_TestBase).m_gl)->getPointerv)(0x8245,&local_1b0);
      GVar1 = (*((this->super_TestBase).m_gl)->getError)();
      glu::checkError(GVar1,"GetPointerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                      ,0x725);
      if (local_1b0 == expected_user_info) {
        return;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid state of DEBUG_CALLBACK_USER_PARAM",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x729);
    }
    else {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid state of DEBUG_CALLBACK_FUNCTION",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x720);
    }
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"State of DEBUG_OUTPUT: ",0x17);
    local_1b0._0_1_ = local_1b1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1b0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected ",0xb);
    local_1b0 = (void *)CONCAT71(local_1b0._1_7_,expected_state);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1b0,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid state of DEBUG_OUTPUT",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x717);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReceiveingMessagesTest::inspectDebugState(GLboolean expected_state, GLDEBUGPROC expected_callback,
											   GLvoid* expected_user_info) const
{
	GLboolean debug_state = -1;
	m_gl->getBooleanv(GL_DEBUG_OUTPUT, &debug_state);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetBooleanv");

	if (expected_state != debug_state)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "State of DEBUG_OUTPUT: " << debug_state
											<< ", expected " << expected_state << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid state of DEBUG_OUTPUT");
	}

	GLvoid* callback_procedure = 0;
	m_gl->getPointerv(GL_DEBUG_CALLBACK_FUNCTION, &callback_procedure);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetPointerv");

	if (expected_callback != callback_procedure)
	{
		TCU_FAIL("Invalid state of DEBUG_CALLBACK_FUNCTION");
	}

	GLvoid* callback_user_info = 0;
	m_gl->getPointerv(GL_DEBUG_CALLBACK_USER_PARAM, &callback_user_info);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetPointerv");

	if (expected_user_info != callback_user_info)
	{
		TCU_FAIL("Invalid state of DEBUG_CALLBACK_USER_PARAM");
	}
}